

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O0

MPP_RET vepu510_h265_set_patch_info
                  (H265eSyntax_new *syn,Vepu541Fmt input_fmt,MppDevRegOffCfgs *offsets,
                  HalEncTask *task)

{
  ushort uVar1;
  uint uVar2;
  MPP_RET MVar3;
  MppFrameFormat MVar4;
  uint local_44;
  MPP_RET local_40;
  MPP_RET local_3c;
  MPP_RET ret;
  RK_U32 v_offset;
  RK_U32 u_offset;
  RK_U32 frame_size;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  HalEncTask *task_local;
  MppDevRegOffCfgs *offsets_local;
  Vepu541Fmt input_fmt_local;
  H265eSyntax_new *syn_local;
  
  uVar2 = (uint)(syn->pp).hor_stride;
  if ((syn->pp).ver_stride == 0) {
    uVar1 = (syn->pp).pic_height;
  }
  else {
    uVar1 = (syn->pp).ver_stride;
  }
  local_44 = (uint)uVar1;
  MVar3 = uVar2 * local_44;
  ret = MPP_OK;
  local_3c = MPP_OK;
  local_40 = MPP_OK;
  MVar4 = mpp_frame_get_fmt(task->frame);
  if ((MVar4 & 0xf00000) == MPP_FMT_YUV420SP) {
    ret = MVar3;
    switch(input_fmt) {
    case VEPU541_FMT_BGRA8888:
    case VEPU541_FMT_BGR888:
    case VEPU541_FMT_BGR565:
      ret = MPP_OK;
      local_3c = MPP_OK;
      break;
    default:
      _mpp_log_l(2,"hal_h265e_v510","unknown color space: %d\n","vepu510_h265_set_patch_info",
                 (ulong)input_fmt);
      local_3c = (uint)(MVar3 * 5) >> 2;
      break;
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUV420SP:
      local_3c = MVar3;
      break;
    case VEPU541_FMT_YUV422P:
      local_3c = (uint)(MVar3 * 3) >> 1;
      break;
    case VEPU541_FMT_YUV420P:
      local_3c = (uint)(MVar3 * 5) >> 2;
      break;
    case VEPU541_FMT_YUYV422:
    case VEPU541_FMT_UYVY422:
    case VEPU540_FMT_YUV400:
      ret = MPP_OK;
      local_3c = MPP_OK;
      break;
    case VEPU580_FMT_YUV444SP:
      local_3c = uVar2 * local_44;
      ret = uVar2 * local_44;
      break;
    case VEPU580_FMT_YUV444P:
      local_3c = uVar2 * local_44 * 2;
      ret = uVar2 * local_44;
    }
  }
  else {
    _mpp_log_l(2,"hal_h265e_v510","VEPU_510 unsupports FBC format input.\n",(char *)0x0);
    local_40 = MPP_NOK;
  }
  mpp_dev_multi_offset_update(offsets,0xa1,ret);
  mpp_dev_multi_offset_update(offsets,0xa2,local_3c);
  return local_40;
}

Assistant:

static MPP_RET
vepu510_h265_set_patch_info(H265eSyntax_new *syn, Vepu541Fmt input_fmt,  MppDevRegOffCfgs *offsets, HalEncTask *task)
{
    RK_U32 hor_stride = syn->pp.hor_stride;
    RK_U32 ver_stride = syn->pp.ver_stride ? syn->pp.ver_stride : syn->pp.pic_height;
    RK_U32 frame_size = hor_stride * ver_stride;
    RK_U32 u_offset = 0, v_offset = 0;
    MPP_RET ret = MPP_OK;

    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(task->frame))) {
        mpp_err("VEPU_510 unsupports FBC format input.\n");

        ret = MPP_NOK;
    } else {
        switch (input_fmt) {
        case VEPU541_FMT_YUV420P: {
            u_offset = frame_size;
            v_offset = frame_size * 5 / 4;
        } break;
        case VEPU541_FMT_YUV420SP:
        case VEPU541_FMT_YUV422SP: {
            u_offset = frame_size;
            v_offset = frame_size;
        } break;
        case VEPU541_FMT_YUV422P: {
            u_offset = frame_size;
            v_offset = frame_size * 3 / 2;
        } break;
        case VEPU540_FMT_YUV400:
        case VEPU541_FMT_YUYV422:
        case VEPU541_FMT_UYVY422: {
            u_offset = 0;
            v_offset = 0;
        } break;
        case VEPU541_FMT_BGR565:
        case VEPU541_FMT_BGR888:
        case VEPU541_FMT_BGRA8888: {
            u_offset = 0;
            v_offset = 0;
        } break;
        case VEPU580_FMT_YUV444SP : {
            u_offset = hor_stride * ver_stride;
            v_offset = hor_stride * ver_stride;
        } break;
        case VEPU580_FMT_YUV444P : {
            u_offset = hor_stride * ver_stride;
            v_offset = hor_stride * ver_stride * 2;
        } break;
        default: {
            hal_h265e_err("unknown color space: %d\n", input_fmt);
            u_offset = frame_size;
            v_offset = frame_size * 5 / 4;
        }
        }
    }
    mpp_dev_multi_offset_update(offsets, 161, u_offset);
    mpp_dev_multi_offset_update(offsets, 162, v_offset);

    return ret;
}